

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  MethodDescriptorProto *this_00;
  ServiceOptions *this_01;
  void *pvVar2;
  uint8 *puVar3;
  int iVar4;
  uint8 *local_40;
  uint local_34;
  
  local_34 = (this->_has_bits_).has_bits_[0];
  local_40 = target;
  if ((local_34 & 1) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_00 = (MethodDescriptorProto *)
              ((this->method_).super_RepeatedPtrFieldBase.rep_)->elements[iVar4];
    *local_40 = '\x12';
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = MethodDescriptorProto::InternalSerializeWithCachedSizesToArray(this_00,puVar3,stream)
    ;
  }
  if ((local_34 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_01 = this->options_;
    *local_40 = '\x1a';
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = ServiceOptions::InternalSerializeWithCachedSizesToArray(this_01,puVar3,stream);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    local_40 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_method_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_method(i), target, stream);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceDescriptorProto)
  return target;
}